

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O1

int archive_write_set_format_gnutar(archive *_a)

{
  int iVar1;
  void *pvVar2;
  
  pvVar2 = calloc(1,0x68);
  if (pvVar2 == (void *)0x0) {
    archive_set_error(_a,0xc,"Can\'t allocate gnutar data");
    iVar1 = -0x1e;
  }
  else {
    *(void **)&_a[1].current_codepage = pvVar2;
    _a[1].sconv = (archive_string_conv *)0x23deb3;
    _a[2].vtable = (archive_vtable_conflict *)archive_write_gnutar_options;
    _a[2].archive_format_name = (char *)archive_write_gnutar_header;
    *(code **)&_a[2].compression_code = archive_write_gnutar_data;
    _a[2].compression_name = (char *)archive_write_gnutar_close;
    *(code **)&_a[2].file_count = archive_write_gnutar_free;
    *(code **)&_a[2].archive_format = archive_write_gnutar_finish_entry;
    _a->archive_format = 0x30004;
    _a->archive_format_name = "GNU tar";
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
archive_write_set_format_gnutar(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct gnutar *gnutar;

	gnutar = (struct gnutar *)calloc(1, sizeof(*gnutar));
	if (gnutar == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate gnutar data");
		return (ARCHIVE_FATAL);
	}
	a->format_data = gnutar;
	a->format_name = "gnutar";
	a->format_options = archive_write_gnutar_options;
	a->format_write_header = archive_write_gnutar_header;
	a->format_write_data = archive_write_gnutar_data;
	a->format_close = archive_write_gnutar_close;
	a->format_free = archive_write_gnutar_free;
	a->format_finish_entry = archive_write_gnutar_finish_entry;
	a->archive.archive_format = ARCHIVE_FORMAT_TAR_GNUTAR;
	a->archive.archive_format_name = "GNU tar";
	return (ARCHIVE_OK);
}